

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O3

cbtTriangleInfoMap * __thiscall
cbtCollisionWorldImporter::createTriangleInfoMap(cbtCollisionWorldImporter *this)

{
  cbtTriangleInfoMap **ptr;
  uint uVar1;
  cbtTriangleInfoMap *this_00;
  cbtTriangleInfoMap **ppcVar2;
  ulong uVar3;
  int iVar4;
  
  this_00 = (cbtTriangleInfoMap *)::operator_new(0xa0);
  cbtTriangleInfoMap::cbtTriangleInfoMap(this_00);
  uVar1 = (this->m_allocatedTriangleInfoMaps).m_size;
  if (uVar1 == (this->m_allocatedTriangleInfoMaps).m_capacity) {
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if ((int)uVar1 < iVar4) {
      if (iVar4 == 0) {
        ppcVar2 = (cbtTriangleInfoMap **)0x0;
      }
      else {
        ppcVar2 = (cbtTriangleInfoMap **)cbtAlignedAllocInternal((long)iVar4 << 3,0x10);
        uVar1 = (this->m_allocatedTriangleInfoMaps).m_size;
      }
      if (0 < (int)uVar1) {
        uVar3 = 0;
        do {
          ppcVar2[uVar3] = (this->m_allocatedTriangleInfoMaps).m_data[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
      }
      ptr = (this->m_allocatedTriangleInfoMaps).m_data;
      if ((ptr != (cbtTriangleInfoMap **)0x0) &&
         ((this->m_allocatedTriangleInfoMaps).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(ptr);
        uVar1 = (this->m_allocatedTriangleInfoMaps).m_size;
      }
      (this->m_allocatedTriangleInfoMaps).m_ownsMemory = true;
      (this->m_allocatedTriangleInfoMaps).m_data = ppcVar2;
      (this->m_allocatedTriangleInfoMaps).m_capacity = iVar4;
    }
  }
  (this->m_allocatedTriangleInfoMaps).m_data[(int)uVar1] = this_00;
  (this->m_allocatedTriangleInfoMaps).m_size = uVar1 + 1;
  return this_00;
}

Assistant:

cbtTriangleInfoMap* cbtCollisionWorldImporter::createTriangleInfoMap()
{
	cbtTriangleInfoMap* tim = new cbtTriangleInfoMap();
	m_allocatedTriangleInfoMaps.push_back(tim);
	return tim;
}